

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_perform(Curl_easy *data)

{
  char *pcVar1;
  CURLMcode CVar2;
  Curl_multi *multi;
  CURLMsg *pCVar3;
  CURLcode CVar4;
  bool bVar5;
  int still_running;
  sigpipe_ignore pipe_st;
  int local_d8;
  int local_d4;
  sigpipe_ignore local_d0;
  
  if (data == (Curl_easy *)0x0) {
    CVar4 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pcVar1 = (data->set).errorbuffer;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (data->multi == (Curl_multi *)0x0) {
      multi = data->multi_easy;
      if (multi == (Curl_multi *)0x0) {
        multi = Curl_multi_handle(1,3,7);
        if (multi == (Curl_multi *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        data->multi_easy = multi;
      }
      CVar4 = CURLE_RECURSIVE_API_CALL;
      if ((multi->field_0x1b1 & 4) == 0) {
        CVar4 = CURLE_OK;
        curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(ulong)(data->set).maxconnects);
        CVar2 = curl_multi_add_handle(multi,data);
        if (CVar2 == CURLM_OK) {
          sigpipe_ignore(data,&local_d0);
          do {
            local_d8 = 0;
            CVar2 = curl_multi_poll(multi,(curl_waitfd *)0x0,0,1000,(int *)0x0);
            if (CVar2 != CURLM_OK) {
              CVar4 = (uint)(CVar2 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
              goto LAB_005ce31a;
            }
            CVar2 = curl_multi_perform(multi,&local_d8);
            if (local_d8 == 0 && CVar2 == CURLM_OK) {
              pCVar3 = curl_multi_info_read(multi,&local_d4);
              bVar5 = pCVar3 != (CURLMsg *)0x0;
              if (bVar5) {
                CVar4 = (pCVar3->data).result;
              }
            }
            else {
              bVar5 = false;
            }
          } while ((CVar2 == CURLM_OK) && (!bVar5));
          if (CVar2 != CURLM_OK) {
            CVar4 = (uint)(CVar2 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
          }
LAB_005ce31a:
          curl_multi_remove_handle(multi,data);
          if (local_d0.no_signal == false) {
            sigaction(0xd,(sigaction *)&local_d0,(sigaction *)0x0);
          }
        }
        else {
          curl_multi_cleanup(multi);
          data->multi_easy = (Curl_multi *)0x0;
          CVar4 = CURLE_FAILED_INIT;
          if (CVar2 == CURLM_OUT_OF_MEMORY) {
            CVar4 = CURLE_OUT_OF_MEMORY;
          }
        }
      }
    }
    else {
      Curl_failf(data,"easy handle already used in multi handle");
      CVar4 = CURLE_FAILED_INIT;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3, 7);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, (long)data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    data->multi_easy = NULL;
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}